

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikye(fitsfile *fptr,char *keyname,float value,int decim,char *comm,int *status)

{
  int *in_R8;
  char card [81];
  char valstring [71];
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  undefined4 local_4;
  
  if (*in_R8 < 1) {
    ffr2e(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
          in_stack_ffffffffffffff28);
    ffmkky((char *)card._72_8_,(char *)card._64_8_,(char *)card._56_8_,(char *)card._48_8_,
           (int *)card._40_8_);
    ffikey((fitsfile *)card._40_8_,(char *)card._32_8_,(int *)card._24_8_);
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffikye(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           float value,             /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */ 
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffr2e(value, decim, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);  /* write the keyword*/

    return(*status);
}